

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.c
# Opt level: O2

lexicon_t * lexicon_read(lexicon_t *prior_lex,char *filename,acmod_set_t *acmod_set)

{
  word_id_t wVar1;
  int32 iVar2;
  acmod_id_t aVar3;
  FILE *__stream;
  lineiter_t *li;
  lex_entry_t *entry;
  char *pcVar4;
  char **ppcVar5;
  acmod_id_t *paVar6;
  char *name;
  uint uVar7;
  word_id_t wVar8;
  ulong uVar9;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                   ,0xa1,"Unable to open dictionary file \'%s\' for reading\n",filename);
    exit(1);
  }
  if (prior_lex == (lexicon_t *)0x0) {
    prior_lex = lexicon_new();
  }
  if (prior_lex->phone_set == (acmod_set_t *)0x0) {
    prior_lex->phone_set = acmod_set;
  }
  wVar1 = prior_lex->entry_cnt;
  li = lineiter_start_clean((FILE *)__stream);
  wVar8 = wVar1;
  do {
    if (li == (lineiter_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
              ,0xdd,"%d entries added from %s\n",(ulong)(wVar8 - wVar1),filename);
      lineiter_free((lineiter_t *)0x0);
      fclose(__stream);
      return prior_lex;
    }
    if (*li->buf == '\0') {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
              ,0xb1,"Dictionary file \'%s\' has a blank line at line %d\n",filename,0);
    }
    else {
      entry = lexicon_append_entry(prior_lex);
      pcVar4 = strdup(li->buf);
      pcVar4 = strtok(pcVar4," \t");
      entry->ortho = pcVar4;
      entry->word_id = wVar8;
      uVar9 = 0;
      iVar2 = str2words(li->buf,(char **)0x0,0);
      uVar7 = iVar2 - 1;
      ppcVar5 = (char **)__ckd_calloc__((ulong)uVar7,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                                        ,0x4e);
      entry->phone = ppcVar5;
      paVar6 = (acmod_id_t *)
               __ckd_calloc__((ulong)uVar7,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                              ,0x50);
      entry->ci_acmod_id = paVar6;
      entry->phone_cnt = uVar7;
      while( true ) {
        name = strtok((char *)0x0," \t");
        if (name == (char *)0x0) break;
        entry->phone[uVar9] = name;
        aVar3 = acmod_set_name2id(acmod_set,name);
        entry->ci_acmod_id[uVar9] = aVar3;
        if (aVar3 == 0xffffffff) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                  ,0x5a,"Unknown phone %s\n",name);
          ckd_free(entry->phone);
          entry->phone = (char **)0x0;
          ckd_free(entry->ci_acmod_id);
          entry->ci_acmod_id = (acmod_id_t *)0x0;
          entry->phone_cnt = 0;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                  ,0xd3,"pronunciation for %s has undefined phones; skipping.\n",pcVar4);
          lexicon_entry_free(entry);
          goto LAB_00118683;
        }
        uVar9 = (ulong)((uint)uVar9 + 1);
      }
      if (uVar7 != (uint)uVar9) {
        __assert_fail("i == n_phone",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/lexicon.c"
                      ,0x67,"int add_phones(uint32, lex_entry_t *, acmod_set_t *)");
      }
      hash_table_enter(prior_lex->ht,entry->ortho,entry);
      wVar8 = wVar8 + 1;
    }
LAB_00118683:
    li = lineiter_next(li);
  } while( true );
}

Assistant:

lexicon_t *lexicon_read(lexicon_t *prior_lex,
			const char *filename,
			acmod_set_t *acmod_set)
{
    FILE *lex_fp;
    lineiter_t *line = NULL;
    char *lex_line;
    lexicon_t *lex;
    lex_entry_t *next_entry = NULL;
    uint32    wid, start_wid;
    uint32    n_phone;
    uint32    lineno = 0;
    int       reuse_entry = FALSE;
    char      *word;

    lex_fp = fopen(filename, "r");
    if (lex_fp == NULL) {
	E_FATAL_SYSTEM("Unable to open dictionary file '%s' for reading\n",
		       filename);
    }

    if (prior_lex)
	lex = prior_lex;
    else
	lex = lexicon_new();

    if (lex->phone_set == NULL)
	lex->phone_set = acmod_set;

    start_wid = wid = lex->entry_cnt;
    for (line = lineiter_start_clean(lex_fp); line; line = lineiter_next(line)) {

	if (line->buf[0] == 0) {
	    E_WARN("Dictionary file '%s' has a blank line at line %d\n",
		   filename, lineno);
	    continue;
	}
	
	next_entry = lexicon_append_entry(lex);

	/* allocate space for string.  It will be parsed
	 * by strtok() */
	lex_line = strdup(line->buf);

	/* get the word and make a hash table entry for
	   this lexicon entry */

	word = strtok(lex_line, " \t");	

	if (add_word(word,
		     wid,
		     lex,
		     next_entry) != S3_SUCCESS) {
	    E_ERROR("%s duplicate entry?\n", word);
	    lexicon_entry_free(next_entry);
	    continue;
	}

	/* str2words() counts the # of space separated "words" on a line */
	n_phone = str2words(line->buf, NULL, 0) - 1;

#ifdef LEXICON_VERBOSE
	E_INFO("%s %d phones\n", line->buf, n_phone);
#endif

	/* read the phones, convert to ids and add them
	   to the phone list for this entry */
	if (add_phones(n_phone, next_entry, acmod_set) != S3_SUCCESS) {
	    E_ERROR("pronunciation for %s has undefined phones; skipping.\n", word);
	    lexicon_entry_free(next_entry);
	    continue;
	}
	
	hash_table_enter(lex->ht, next_entry->ortho, (void *)next_entry);
	++wid;	/* only happens should everything be successful */
    }

    E_INFO("%d entries added from %s\n",
	   wid - start_wid, filename);
			  
    lineiter_free(line);
    fclose(lex_fp);
    
    return lex;
}